

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

void duckdb::DateTruncFunction<duckdb::timestamp_t,duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  DatePartSpecifier DVar4;
  reference left;
  reference right;
  NotImplementedException *this;
  uint *puVar5;
  string local_50;
  
  left = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  right = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (left->vector_type != CONSTANT_VECTOR) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
              (left,right,result,args->count,false);
    return;
  }
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  puVar3 = (uint *)left->data;
  if ((ulong)*puVar3 < 0xd) {
    puVar5 = puVar3 + 1;
  }
  else {
    puVar5 = *(uint **)(puVar3 + 2);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,puVar5,(ulong)*puVar3 + (long)puVar5);
  DVar4 = GetDatePartSpecifier(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (DVar4 < BEGIN_INVALID) {
    switch(DVar4) {
    case BEGIN_BIGINT:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::YearOperator>
      ;
      break;
    case MONTH:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MonthOperator>
      ;
      break;
    default:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DayOperator>
      ;
      break;
    case DECADE:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::DecadeOperator>
      ;
      break;
    case CENTURY:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::CenturyOperator>
      ;
      break;
    case MILLENNIUM:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillenniumOperator>
      ;
      break;
    case MICROSECONDS:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MicrosecondOperator>
      ;
      break;
    case MILLISECONDS:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillisecondOperator>
      ;
      break;
    case SECOND:
    case BEGIN_DOUBLE:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::SecondOperator>
      ;
      break;
    case MINUTE:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MinuteOperator>
      ;
      break;
    case HOUR:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
      ;
      break;
    case WEEK:
    case YEARWEEK:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::WeekOperator>
      ;
      break;
    case ISOYEAR:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::ISOYearOperator>
      ;
      break;
    case QUARTER:
      local_50._M_dataplus._M_p =
           (pointer)DateTrunc::
                    UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::QuarterOperator>
      ;
      break;
    case ERA:
    case TIMEZONE:
    case TIMEZONE_HOUR:
    case TIMEZONE_MINUTE:
      goto switchD_019ce1b7_caseD_12;
    }
    UnaryExecutor::
    ExecuteStandard<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::UnaryLambdaWrapper,duckdb::timestamp_t(*)(duckdb::timestamp_t)>
              (right,result,args->count,&local_50,false,CAN_THROW_RUNTIME_ERROR);
    return;
  }
switchD_019ce1b7_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Specifier type not implemented for DATETRUNC","");
  NotImplementedException::NotImplementedException(this,&local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void DateTruncFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &part_arg = args.data[0];
	auto &date_arg = args.data[1];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateTruncUnaryExecutor<TA, TR>(type, date_arg, result, args.size());
		}
	} else {
		BinaryExecutor::ExecuteStandard<string_t, TA, TR, DateTruncBinaryOperator>(part_arg, date_arg, result,
		                                                                           args.size());
	}
}